

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraUtilMisc.c
# Opt level: O2

uint Extra_TruthCanonNN(uint uTruth,int nVars)

{
  byte bVar1;
  uint uVar2;
  uint uVar3;
  byte bVar4;
  int iVar5;
  uint uVar6;
  int Polarity;
  
  bVar1 = (byte)nVars & 0x1f;
  iVar5 = 1 << bVar1;
  bVar4 = -(char)iVar5;
  Polarity = 0;
  if (1 << bVar1 < 1) {
    iVar5 = 0;
  }
  uVar6 = 0xffffffff;
  for (; iVar5 != Polarity; Polarity = Polarity + 1) {
    uVar2 = Extra_TruthPolarize(uTruth,Polarity,nVars);
    if (uVar6 < uVar2) {
      uVar2 = uVar6;
    }
    uVar3 = Extra_TruthPolarize((~uTruth << (bVar4 & 0x1f)) >> (bVar4 & 0x1f),Polarity,nVars);
    uVar6 = uVar2;
    if (uVar3 <= uVar2) {
      uVar6 = uVar3;
    }
  }
  return uVar6;
}

Assistant:

unsigned Extra_TruthCanonNN( unsigned uTruth, int nVars )
{
    unsigned uTruthMin, uTruthC, uPhase;
    int nMints, i;
    nMints    = (1 << nVars);
    uTruthC   = (unsigned)( (~uTruth) & ((~((unsigned)0)) >> (32-nMints)) );
    uTruthMin = 0xFFFFFFFF;
    for ( i = 0; i < nMints; i++ )
    {
        uPhase = Extra_TruthPolarize( uTruth, i, nVars ); 
        if ( uTruthMin > uPhase )
            uTruthMin = uPhase;
        uPhase = Extra_TruthPolarize( uTruthC, i, nVars ); 
        if ( uTruthMin > uPhase )
            uTruthMin = uPhase;
    }
    return uTruthMin;
}